

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

unique_ptr<Catch::TestSpec::TagPattern>
Catch::Detail::make_unique<Catch::TestSpec::TagPattern,char_const(&)[2],std::__cxx11::string&>
          (char (*args) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  TagPattern *ptr;
  string *in_RSI;
  TagPattern *in_RDI;
  string *tag;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffb4;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  ptr = (TagPattern *)operator_new(0x48);
  uVar1 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
  tag = (string *)&stack0xffffffffffffffc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  TestSpec::TagPattern::TagPattern
            ((TagPattern *)CONCAT44(in_stack_ffffffffffffffb4,uVar1),tag,in_RSI);
  unique_ptr<Catch::TestSpec::TagPattern>::unique_ptr
            ((unique_ptr<Catch::TestSpec::TagPattern> *)in_RDI,ptr);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  return (unique_ptr<Catch::TestSpec::TagPattern>)in_RDI;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }